

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_BrepFace * __thiscall
ON_Brep::NewConeFace(ON_Brep *this,ON_BrepVertex *vertex,ON_BrepEdge *edge,bool bRevEdge)

{
  int vi1;
  int iVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepVertex *pOVar3;
  ON_NurbsSurface *this_00;
  ON_BrepFace *pOVar4;
  bool bRev3d [4];
  ON_NurbsCurve c;
  undefined4 local_9c;
  int local_98;
  int iStack_94;
  undefined4 uStack_90;
  int iStack_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  ON_NurbsCurve local_70;
  
  pOVar2 = Edge(this,edge->m_edge_index);
  if ((pOVar2 != edge) || (pOVar3 = Vertex(this,vertex->m_vertex_index), pOVar3 != vertex)) {
    return (ON_BrepFace *)0x0;
  }
  if (edge->m_vi[0] == vertex->m_vertex_index) {
    return (ON_BrepFace *)0x0;
  }
  if (edge->m_vi[1] == vertex->m_vertex_index) {
    return (ON_BrepFace *)0x0;
  }
  ON_NurbsCurve::ON_NurbsCurve(&local_70);
  iVar1 = (*(edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x3f])(0,edge,&local_70,0);
  if (iVar1 != 0) {
    if (bRevEdge) {
      ON_NurbsCurve::Reverse(&local_70);
    }
    this_00 = ON_NurbsSurface::New();
    iVar1 = ON_NurbsSurface::CreateConeSurface
                      (this_00,(vertex->super_ON_Point).point,&local_70.super_ON_Curve,
                       (ON_Interval *)0x0);
    if (iVar1 != 0) {
      iVar1 = edge->m_vi[bRevEdge];
      local_84 = edge->m_vi[!bRevEdge];
      vi1 = vertex->m_vertex_index;
      iStack_94 = -1;
      uStack_90 = 0xffffffff;
      iStack_8c = -1;
      local_98 = edge->m_edge_index;
      local_9c = (uint)bRevEdge;
      local_88 = iVar1;
      local_80 = vi1;
      local_7c = vi1;
      pOVar2 = FindLinearEdge(this,local_84,vi1);
      if (pOVar2 != (ON_BrepEdge *)0x0) {
        iStack_94 = pOVar2->m_edge_index;
        local_9c._0_2_ = CONCAT11(pOVar2->m_vi[0] == vi1,local_9c._0_1_);
      }
      pOVar2 = FindLinearEdge(this,vi1,iVar1);
      if (pOVar2 != (ON_BrepEdge *)0x0) {
        iStack_8c = pOVar2->m_edge_index;
        local_9c = CONCAT13(pOVar2->m_vi[0] == iVar1,(undefined3)local_9c);
      }
      pOVar4 = NewFace(this,&this_00->super_ON_Surface,&local_88,&local_98,(bool *)&local_9c);
      if (pOVar4 != (ON_BrepFace *)0x0) {
        SynchFaceOrientation(this,pOVar4->m_face_index);
      }
      goto LAB_0043631a;
    }
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  pOVar4 = (ON_BrepFace *)0x0;
LAB_0043631a:
  ON_NurbsCurve::~ON_NurbsCurve(&local_70);
  return pOVar4;
}

Assistant:

ON_BrepFace* ON_Brep::NewConeFace(
      const ON_BrepVertex& vertex,
      const ON_BrepEdge& edge,
      bool bRevEdge
      )
{
  if ( Edge( edge.m_edge_index) != &edge )
    return nullptr;
  if ( Vertex( vertex.m_vertex_index) != &vertex )
    return nullptr;
  if ( edge.m_vi[0] == vertex.m_vertex_index )
    return nullptr;
  if ( edge.m_vi[1] == vertex.m_vertex_index )
    return nullptr;
  ON_NurbsCurve c;
  if ( !edge.GetNurbForm( c ) )
    return nullptr;
  if ( bRevEdge )
    c.Reverse();
  ON_NurbsSurface* srf = ON_NurbsSurface::New();
  if ( !srf->CreateConeSurface( vertex.point, c ) )
  {
    delete srf;
    return nullptr;
  }

  // corner vertices (sw,se,ne,nw)
  int vid[4] = {-1,-1,-1,-1};
  vid[0] = edge.m_vi[bRevEdge?1:0];
  vid[1] = edge.m_vi[bRevEdge?0:1];
  vid[2] = vertex.m_vertex_index;
  vid[3] = vertex.m_vertex_index;

  // side edges (s,e,n,w)
  int eid[4] = {-1,-1,-1,-1};
  bool bRev3d[4] = {false,false,false,false};
  
  // south side
  eid[0] = edge.m_edge_index;
  bRev3d[0] = bRevEdge;
  
  // east side
  const ON_BrepEdge* east_edge = FindLinearEdge( *this, vid[1], vid[2] );
  if ( east_edge )
  {
    eid[1] = east_edge->m_edge_index;
    bRev3d[1] = (east_edge->m_vi[0] == vid[2]);
  }

  // west side
  const ON_BrepEdge* west_edge = FindLinearEdge( *this, vid[3], vid[0] );
  if ( west_edge )
  {
    eid[3] = west_edge->m_edge_index;
    bRev3d[3] = (west_edge->m_vi[0] == vid[0]);
  }

  ON_BrepFace* face = NewFace( srf, vid, eid, bRev3d );
  if ( face )
    SynchFaceOrientation( *this, face->m_face_index );
  return face;
}